

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_sendrecv_replace_
               (void *buf,MPIABI_Fint *count,MPIABI_Fint *datatype,MPIABI_Fint *dest,
               MPIABI_Fint *sendtag,MPIABI_Fint *source,MPIABI_Fint *recvtag,MPIABI_Fint *comm,
               MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_sendrecv_replace_();
  return;
}

Assistant:

void mpiabi_sendrecv_replace_(
  void * buf,
  const MPIABI_Fint * count,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * dest,
  const MPIABI_Fint * sendtag,
  const MPIABI_Fint * source,
  const MPIABI_Fint * recvtag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_sendrecv_replace_(
    buf,
    count,
    datatype,
    dest,
    sendtag,
    source,
    recvtag,
    comm,
    status,
    ierror
  );
}